

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_logger.c
# Opt level: O1

int SUNLogger_GetOutputRank(SUNLogger logger,int *output_rank)

{
  if (logger != (SUNLogger)0x0) {
    *output_rank = logger->output_rank;
    return 0;
  }
  return -1;
}

Assistant:

int SUNLogger_GetOutputRank(SUNLogger logger, int* output_rank)
{
  int retval = 0;
  if (logger == NULL)
  {
    retval = -1;
  }
  else
  {
    *output_rank = logger->output_rank;
    retval       = 0;
  }
  return retval;
}